

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

EntryType * __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_*,_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<Js::PropertyRecord_*,_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  undefined1 auVar1 [16];
  Recycler *this_00;
  EntryType *pEVar2;
  code *AllocFunc;
  ulong uVar3;
  EntryType *pEVar4;
  ulong uVar5;
  size_t byteSize;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 local_40 [8];
  TrackAllocData data;
  
  sVar6 = (size_t)size;
  local_40 = (undefined1  [8])
             &SimpleHashedEntry<Memory::WriteBarrierPtr<Js::PropertyRecord>,Memory::WriteBarrierPtr<Js::PropertyRecord>>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_1369e8;
  data.filename._0_4_ = 0x453;
  data.plusSize = sVar6;
  this_00 = Memory::Recycler::TrackAllocInfo(this->alloc,(TrackAllocData *)local_40);
  if (size == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pEVar2 = (EntryType *)&DAT_00000008;
  }
  else {
    if (zeroAllocate) {
      AllocFunc = Memory::Recycler::AllocZeroWithBarrier;
    }
    else {
      AllocFunc = Memory::Recycler::AllocWithBarrier;
    }
    byteSize = 0xffffffffffffffff;
    if (-1 < size) {
      byteSize = sVar6 << 4;
    }
    uVar5 = 0;
    pEVar2 = (EntryType *)
             new__<Memory::Recycler>(byteSize,this_00,(offset_in_Recycler_to_subr)AllocFunc);
    auVar1 = _DAT_00fa8550;
    uVar3 = sVar6 + 0xfffffffffffffff & 0xfffffffffffffff;
    auVar7._8_4_ = (int)uVar3;
    auVar7._0_8_ = uVar3;
    auVar7._12_4_ = (int)(uVar3 >> 0x20);
    pEVar4 = pEVar2 + 1;
    auVar8 = pmovsxbq(in_XMM1,0x100);
    auVar7 = auVar7 | _DAT_00fa8550;
    do {
      if ((bool)(~(auVar7._0_8_ < (long)(uVar5 ^ auVar1._0_8_)) & 1)) {
        pEVar4[-1].
        super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::PropertyRecord>,_Memory::WriteBarrierPtr<Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
        .
        super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::PropertyRecord>,_Memory::WriteBarrierPtr<Js::PropertyRecord>_>
        .
        super_ValueEntry<Memory::WriteBarrierPtr<Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::PropertyRecord>_>_>
        .super_ValueEntryData<Memory::WriteBarrierPtr<Js::PropertyRecord>_>.value.ptr =
             (PropertyRecord *)0x0;
      }
      auVar9._8_4_ = (int)uVar5;
      auVar9._0_8_ = uVar5;
      auVar9._12_4_ = (int)(uVar5 >> 0x20);
      if ((long)((auVar9._8_8_ | auVar8._8_8_) ^ auVar1._8_8_) <= auVar7._8_8_) {
        (pEVar4->
        super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::PropertyRecord>,_Memory::WriteBarrierPtr<Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
        ).
        super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::PropertyRecord>,_Memory::WriteBarrierPtr<Js::PropertyRecord>_>
        .
        super_ValueEntry<Memory::WriteBarrierPtr<Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::PropertyRecord>_>_>
        .super_ValueEntryData<Memory::WriteBarrierPtr<Js::PropertyRecord>_>.value.ptr =
             (PropertyRecord *)0x0;
      }
      uVar5 = uVar5 + 2;
      pEVar4 = pEVar4 + 2;
    } while ((uVar3 - ((uint)(sVar6 + 0xfffffffffffffff) & 1)) + 2 != uVar5);
  }
  return pEVar2;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }